

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.c
# Opt level: O0

void unload_game_resources(void)

{
  Level *unaff_retaddr;
  Level *in_stack_00000008;
  
  printf("unload_game_resources\n");
  FreePlayerAnimation((Animation *)0x10a8ab);
  PlayerAnim = (Animation *)0x0;
  FreeState((LevelState *)0x10a8c2);
  LvlState = BorrowState(in_stack_00000008);
  FreeLevel(unaff_retaddr);
  Lvl = (Level *)0x0;
  if (TanTable != (al_fixed *)0x0) {
    free(TanTable);
    TanTable = (al_fixed *)0x0;
  }
  return;
}

Assistant:

void unload_game_resources(void)
{
   printf("unload_game_resources\n");
   FreePlayerAnimation(PlayerAnim);
   PlayerAnim = NULL;

   FreeState(LvlState);
   LvlState = BorrowState(Lvl);
   FreeLevel(Lvl);
   Lvl = NULL;

   if (TanTable) {
      free(TanTable);
      TanTable = NULL;
   }
}